

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableBeginInitMemory(ImGuiTable *table,int columns_count)

{
  int iVar1;
  size_t sVar2;
  void *pvVar3;
  int in_ESI;
  long in_RDI;
  int n;
  ImSpanAllocator<6> span_allocator;
  int columns_bit_array_size;
  size_t in_stack_ffffffffffffffa0;
  int local_54;
  ImSpan<ImGuiTableColumn> *in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffbc;
  ImSpanAllocator<6> *in_stack_ffffffffffffffc0;
  
  sVar2 = ImBitArrayGetStorageSizeInBytes(in_ESI);
  ImSpanAllocator<6>::ImSpanAllocator((ImSpanAllocator<6> *)0x23e8d4);
  ImSpanAllocator<6>::Reserve
            ((ImSpanAllocator<6> *)&stack0xffffffffffffffb0,0,(long)in_ESI * 0x70,4);
  ImSpanAllocator<6>::Reserve((ImSpanAllocator<6> *)&stack0xffffffffffffffb0,1,(long)in_ESI << 1,4);
  ImSpanAllocator<6>::Reserve((ImSpanAllocator<6> *)&stack0xffffffffffffffb0,2,(long)in_ESI << 3,4);
  for (local_54 = 3; local_54 < 6; local_54 = local_54 + 1) {
    ImSpanAllocator<6>::Reserve
              ((ImSpanAllocator<6> *)&stack0xffffffffffffffb0,local_54,(long)(int)sVar2,4);
  }
  ImSpanAllocator<6>::GetArenaSizeInBytes((ImSpanAllocator<6> *)&stack0xffffffffffffffb0);
  pvVar3 = MemAlloc(in_stack_ffffffffffffffa0);
  *(void **)(in_RDI + 8) = pvVar3;
  pvVar3 = *(void **)(in_RDI + 8);
  iVar1 = ImSpanAllocator<6>::GetArenaSizeInBytes((ImSpanAllocator<6> *)&stack0xffffffffffffffb0);
  memset(pvVar3,0,(long)iVar1);
  ImSpanAllocator<6>::SetArenaBasePtr
            ((ImSpanAllocator<6> *)&stack0xffffffffffffffb0,*(void **)(in_RDI + 8));
  ImSpanAllocator<6>::GetSpan<ImGuiTableColumn>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb0);
  ImSpanAllocator<6>::GetSpan<short>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
             (ImSpan<short> *)in_stack_ffffffffffffffb0);
  ImSpanAllocator<6>::GetSpan<ImGuiTableCellData>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
             (ImSpan<ImGuiTableCellData> *)in_stack_ffffffffffffffb0);
  pvVar3 = ImSpanAllocator<6>::GetSpanPtrBegin((ImSpanAllocator<6> *)&stack0xffffffffffffffb0,3);
  *(void **)(in_RDI + 0x48) = pvVar3;
  pvVar3 = ImSpanAllocator<6>::GetSpanPtrBegin((ImSpanAllocator<6> *)&stack0xffffffffffffffb0,4);
  *(void **)(in_RDI + 0x50) = pvVar3;
  pvVar3 = ImSpanAllocator<6>::GetSpanPtrBegin((ImSpanAllocator<6> *)&stack0xffffffffffffffb0,5);
  *(void **)(in_RDI + 0x58) = pvVar3;
  return;
}

Assistant:

void ImGui::TableBeginInitMemory(ImGuiTable* table, int columns_count)
{
    // Allocate single buffer for our arrays
    const int columns_bit_array_size = (int)ImBitArrayGetStorageSizeInBytes(columns_count);
    ImSpanAllocator<6> span_allocator;
    span_allocator.Reserve(0, columns_count * sizeof(ImGuiTableColumn));
    span_allocator.Reserve(1, columns_count * sizeof(ImGuiTableColumnIdx));
    span_allocator.Reserve(2, columns_count * sizeof(ImGuiTableCellData), 4);
    for (int n = 3; n < 6; n++)
        span_allocator.Reserve(n, columns_bit_array_size);
    table->RawData = IM_ALLOC(span_allocator.GetArenaSizeInBytes());
    memset(table->RawData, 0, span_allocator.GetArenaSizeInBytes());
    span_allocator.SetArenaBasePtr(table->RawData);
    span_allocator.GetSpan(0, &table->Columns);
    span_allocator.GetSpan(1, &table->DisplayOrderToIndex);
    span_allocator.GetSpan(2, &table->RowCellData);
    table->EnabledMaskByDisplayOrder = (ImU32*)span_allocator.GetSpanPtrBegin(3);
    table->EnabledMaskByIndex = (ImU32*)span_allocator.GetSpanPtrBegin(4);
    table->VisibleMaskByIndex = (ImU32*)span_allocator.GetSpanPtrBegin(5);
}